

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

Error __thiscall
asmjit::BaseBuilder::_newCommentNode(BaseBuilder *this,CommentNode **out,char *data,size_t size)

{
  int iVar1;
  Error EVar2;
  undefined4 extraout_var;
  CommentNode *pCVar3;
  size_t local_20;
  
  *out = (CommentNode *)0x0;
  if (data == (char *)0x0) {
    data = (char *)0x0;
  }
  else {
    if (size == 0xffffffffffffffff) {
      size = strlen(data);
    }
    if (size != 0) {
      iVar1 = Zone::dup(&this->_dataZone,(int)data);
      data = (char *)CONCAT44(extraout_var,iVar1);
      if (data == (char *)0x0) {
        EVar2 = BaseEmitter::reportError(&this->super_BaseEmitter,1,(char *)0x0);
        return EVar2;
      }
    }
  }
  if ((this->_allocator)._zone == (Zone *)0x0) {
    _newCommentNode();
  }
  else {
    pCVar3 = (CommentNode *)ZoneAllocator::_alloc(&this->_allocator,0x30,&local_20);
    if (pCVar3 != (CommentNode *)0x0) {
      (pCVar3->super_BaseNode).field_0.field_0._prev = (BaseNode *)0x0;
      (pCVar3->super_BaseNode).field_0.field_0._next = (BaseNode *)0x0;
      (pCVar3->super_BaseNode).field_1._any._nodeType = '\t';
      (pCVar3->super_BaseNode).field_1._any._nodeFlags = (byte)this->_nodeFlags | 0x1c;
      *(undefined8 *)((long)&(pCVar3->super_BaseNode).field_1 + 2) = 0;
      *(undefined8 *)((long)&(pCVar3->super_BaseNode).field_3 + 2) = 0;
      (pCVar3->super_BaseNode)._passData = (void *)0x0;
      (pCVar3->super_BaseNode)._inlineComment = data;
      *out = pCVar3;
      return 0;
    }
  }
  *out = (CommentNode *)0x0;
  EVar2 = BaseEmitter::reportError(&this->super_BaseEmitter,1,(char *)0x0);
  return EVar2;
}

Assistant:

Error BaseBuilder::_newCommentNode(CommentNode** out, const char* data, size_t size) {
  *out = nullptr;

  if (data) {
    if (size == SIZE_MAX)
      size = strlen(data);

    if (size > 0) {
      data = static_cast<char*>(_dataZone.dup(data, size, true));
      if (ASMJIT_UNLIKELY(!data))
        return reportError(DebugUtils::errored(kErrorOutOfMemory));
    }
  }

  return _newNodeT<CommentNode>(out, data);
}